

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::descriptor_unittest::FileDescriptorTest_AbslStringifyWorks_Test::TestBody
          (FileDescriptorTest_AbslStringifyWorks_Test *this)

{
  char *message;
  size_type in_R9;
  Metadata MVar1;
  Span<const_absl::lts_20250127::str_format_internal::FormatArgImpl> args;
  UntypedFormatSpecImpl format;
  string s;
  char local_a8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a0;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_98;
  code *local_90;
  long local_88 [2];
  AssertHelper local_78 [2];
  undefined1 local_68 [16];
  PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  string local_38;
  
  MVar1 = proto2_unittest::TestMessageWithCustomOptions::GetMetadata
                    ((TestMessageWithCustomOptions *)
                     proto2_unittest::_TestMessageWithCustomOptions_default_instance_);
  local_98._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (MVar1.descriptor)->file_;
  local_90 = absl::lts_20250127::str_format_internal::FormatArgImpl::
             Dispatch<google::protobuf::FileDescriptor>;
  args.len_ = in_R9;
  args.ptr_ = (pointer)0x1;
  format.size_ = (size_t)&local_98;
  format.data_ = (void *)0x2;
  absl::lts_20250127::str_format_internal::FormatPack_abi_cxx11_
            (&local_38,(str_format_internal *)"%v",format,args);
  testing::HasSubstr<char[29]>(&local_58,(StringLike<char[29]> *)"TestMessageWithCustomOptions");
  local_98._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_98,local_58.impl_.substring_._M_dataplus._M_p,
             local_58.impl_.substring_._M_dataplus._M_p + local_58.impl_.substring_._M_string_length
            );
  local_78[0].data_ = (AssertHelperData *)local_68;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_78,local_98._M_head_impl,local_90 + (long)local_98._M_head_impl);
  if (local_98._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88) {
    operator_delete(local_98._M_head_impl,local_88[0] + 1);
  }
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>>
  ::operator()(local_a8,(char *)local_78,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x142f6c1);
  if (local_78[0].data_ != (AssertHelperData *)local_68) {
    operator_delete(local_78[0].data_,local_68._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.impl_.substring_._M_dataplus._M_p != &local_58.impl_.substring_.field_2) {
    operator_delete(local_58.impl_.substring_._M_dataplus._M_p,
                    local_58.impl_.substring_.field_2._M_allocated_capacity + 1);
  }
  if (local_a8[0] == '\0') {
    testing::Message::Message((Message *)&local_98);
    if (local_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = anon_var_dwarf_a22956 + 5;
    }
    else {
      message = (local_a0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x2e4,message);
    testing::internal::AssertHelper::operator=(local_78,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(local_78);
    if (local_98._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_98._M_head_impl + 8))();
    }
  }
  if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a0,local_a0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

TEST_F(ValidationErrorTest, NegativeExtensionRangeNumber) {
  BuildFileWithErrors(
      "name: \"foo.proto\" "
      "message_type {"
      "  name: \"Foo\""
      "  extension_range { start: -10 end: -1 }"
      "}",

      "foo.proto: Foo: NUMBER: Extension numbers must be positive integers.\n");
}